

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_debugInfo_line_advanceLineAndPC
               (sysbvm_dwarf_debugInfo_builder_t *builder,int deltaLine,int deltaPC)

{
  int iVar1;
  int opcode;
  int operationAdvance;
  int deltaPC_local;
  int deltaLine_local;
  sysbvm_dwarf_debugInfo_builder_t *builder_local;
  
  iVar1 = (deltaLine - (builder->lineProgramHeader).lineBase) +
          (uint)(builder->lineProgramHeader).lineRange *
          (deltaPC / (builder->lineProgramHeader).minimumInstructionLength) +
          (uint)(builder->lineProgramHeader).opcodeBase;
  if ((((iVar1 < 0) || (0xff < iVar1)) ||
      ((int)(uint)(builder->lineProgramHeader).lineRange <=
       deltaLine - (builder->lineProgramHeader).lineBase)) ||
     (deltaLine < (builder->lineProgramHeader).lineBase)) {
    sysbvm_dwarf_debugInfo_line_advanceLine(builder,deltaLine);
    sysbvm_dwarf_debugInfo_line_advancePC(builder,deltaPC);
    sysbvm_dwarf_debugInfo_line_copyRow(builder);
  }
  else {
    sysbvm_dwarf_encodeByte(&builder->line,(uint8_t)iVar1);
    (builder->lineProgramState).regLine = deltaLine + (builder->lineProgramState).regLine;
    (builder->lineProgramState).regAddress = deltaPC + (builder->lineProgramState).regAddress;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_line_advanceLineAndPC(sysbvm_dwarf_debugInfo_builder_t *builder, int deltaLine, int deltaPC)
{
    int operationAdvance = deltaPC / builder->lineProgramHeader.minimumInstructionLength;

    int opcode = (deltaLine - builder->lineProgramHeader.lineBase) + (builder->lineProgramHeader.lineRange * operationAdvance) + builder->lineProgramHeader.opcodeBase;
    if( (0 <= opcode) && (opcode <= 255) 
        && (deltaLine - builder->lineProgramHeader.lineBase < builder->lineProgramHeader.lineRange)
        && (deltaLine >= builder->lineProgramHeader.lineBase) )
    {
        sysbvm_dwarf_encodeByte(&builder->line, opcode);
        builder->lineProgramState.regLine += deltaLine;
        builder->lineProgramState.regAddress += deltaPC;
    }
    else
    {
        sysbvm_dwarf_debugInfo_line_advanceLine(builder, deltaLine);
        sysbvm_dwarf_debugInfo_line_advancePC(builder, deltaPC);
        sysbvm_dwarf_debugInfo_line_copyRow(builder);
    }
}